

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

void inja::inja_throw(string *type,string *message)

{
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_80,"[inja.exception.",type);
  std::operator+(&local_60,&local_80,"] ");
  std::operator+(&local_40,&local_60,message);
  std::runtime_error::runtime_error(this,(string *)&local_40);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void inja_throw(const std::string& type, const std::string& message) {
	throw std::runtime_error("[inja.exception." + type + "] " + message);
}